

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_perobj.cpp
# Opt level: O0

void set_together_method_proc(Am_Object *cmdobj)

{
  ostream *this;
  Am_Object *cmdobj_local;
  
  Am_Object::operator=(cmdobj,(Am_Object *)cmdobj);
  std::operator<<((ostream *)&std::cout,"===== start ===== set together\n");
  Am_Object::Set(25000,0x65,10);
  Am_Object::Set(25000,100,10);
  this = std::operator<<((ostream *)&std::cout,"=====  end  ===== set together\n");
  std::ostream::operator<<(this,std::flush<char,std::char_traits<char>>);
  return;
}

Assistant:

Am_Define_Method(Am_Object_Method, void, set_together_method,
                 (Am_Object cmdobj))
{
  cmdobj = cmdobj;

  cout << "===== start ===== set together\n";
  rect.Set(Am_TOP, 10);
  rect.Set(Am_LEFT, 10);

  cout << "=====  end  ===== set together\n" << flush;
}